

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O0

void testToNonlinear(void)

{
  uint16_t uVar1;
  float fVar2;
  double dVar3;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  int i_1;
  char *tmp;
  float logBase;
  float sign;
  half h;
  unsigned_short usXdr;
  unsigned_short usNative;
  int i;
  unsigned_short toNonlinear [65536];
  undefined4 in_stack_fffffffffffdffb8;
  float in_stack_fffffffffffdffbc;
  half *in_stack_fffffffffffdffc0;
  int iStack_20030;
  float fStack_20018;
  half hStack_20012;
  undefined2 uStack_20010;
  ushort uStack_2000e;
  int iStack_2000c;
  uint16_t auStack_20008 [65540];
  
  for (iStack_2000c = 1; iStack_2000c < 0x10000; iStack_2000c = iStack_2000c + 1) {
    dVar3 = pow(2.7182818,2.2);
    uStack_20010 = (undefined2)iStack_2000c;
    Imf_3_2::Xdr::read<Imf_3_2::CharPtrIO,char_const*>
              ((char **)in_stack_fffffffffffdffc0,
               (unsigned_short *)CONCAT44(in_stack_fffffffffffdffbc,in_stack_fffffffffffdffb8));
    if ((uStack_2000e & 0x7c00) == 0x7c00) {
      auStack_20008[iStack_2000c] = 0;
    }
    else {
      Imath_3_2::half::setBits(&hStack_20012,uStack_2000e);
      fStack_20018 = 1.0;
      fVar2 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffdffc0);
      if (fVar2 < 0.0) {
        fStack_20018 = -1.0;
      }
      fVar2 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffdffc0);
      dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar2));
      if (1.0 < SUB84(dVar4,0)) {
        in_stack_fffffffffffdffc0 = (half *)(double)fStack_20018;
        fVar2 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffdffc0);
        dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db_01,fVar2));
        dVar4 = std::log(dVar4);
        in_stack_fffffffffffdffbc = SUB84(dVar4,0);
        std::log((double)(ulong)(uint)(float)dVar3);
        Imath_3_2::half::half(in_stack_fffffffffffdffc0,in_stack_fffffffffffdffbc);
      }
      else {
        fVar2 = Imath_3_2::half::operator_cast_to_float(in_stack_fffffffffffdffc0);
        dVar3 = std::fabs((double)CONCAT44(extraout_XMM0_Db_00,fVar2));
        std::pow(dVar3,5.21456351771692e-315);
        Imath_3_2::half::half(in_stack_fffffffffffdffc0,in_stack_fffffffffffdffbc);
      }
      uVar1 = Imath_3_2::half::bits(&hStack_20012);
      auStack_20008[iStack_2000c] = uVar1;
    }
  }
  printf("test dwaCompressorToNonlinear[]\n");
  for (iStack_20030 = 0; iStack_20030 < 0x10000; iStack_20030 = iStack_20030 + 1) {
  }
  return;
}

Assistant:

void
testToNonlinear ()
{
    unsigned short toNonlinear[65536];

    toNonlinear[0] = 0;

    for (int i = 1; i < 65536; ++i)
    {
        unsigned short usNative, usXdr;
        half           h;
        float          sign    = 1;
        float          logBase = pow (2.7182818, 2.2);

        usXdr = i;

        {
            const char* tmp = (char*) (&usXdr);

            Xdr::read<CharPtrIO> (tmp, usNative);
        }

        // map  NaN and inf to 0
        if ((usNative & 0x7c00) == 0x7c00)
        {
            toNonlinear[i] = 0;
            continue;
        }

        //
        // toNonlinear - assume i is XDR
        //
        h.setBits (usNative);
        sign = 1;
        if ((float) h < 0) { sign = -1; }

        if (fabs ((float) h) <= 1.0)
        {
            h = (half) (sign * pow (fabs ((float) h), 1.f / 2.2f));
        }
        else
        {
            h = (half) (sign * (log (fabs ((float) h)) / log (logBase) + 1.0));
        }
        toNonlinear[i] = h.bits ();
    }

    printf ("test dwaCompressorToNonlinear[]\n");
    for (int i = 0; i < 65536; ++i)
        assert (
            toNonlinear[i] ==
            OPENEXR_IMF_INTERNAL_NAMESPACE::dwaCompressorToNonlinear[i]);
}